

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O0

ulint __thiscall bwtil::fid_cgap::serialize(fid_cgap *this,ostream *out)

{
  bsd_cgap *pbVar1;
  bool bVar2;
  unsigned_long *puVar3;
  ulint uVar4;
  bsd_cgap *in_RSI;
  long *in_RDI;
  bsd_cgap bsd;
  iterator __end2;
  iterator __begin2;
  vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_> *__range2;
  bool b;
  ulint i;
  ulint w_bytes;
  ulint bsds_size;
  ulint v_sel_size;
  vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_> *in_stack_fffffffffffffe88;
  bsd_cgap *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffea8;
  bsd_cgap *pbVar5;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffeb0;
  bsd_cgap *this_00;
  ostream *in_stack_fffffffffffffed0;
  cgap_dictionary *in_stack_fffffffffffffed8;
  bsd_cgap *in_stack_fffffffffffffee0;
  __normal_iterator<bwtil::bsd_cgap_*,_std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>_>
  local_60;
  long *local_58;
  reference local_50;
  undefined1 local_39;
  ulong local_38;
  long local_30;
  size_type local_28;
  size_type local_20;
  bsd_cgap *local_18;
  ulint local_8;
  
  local_18 = in_RSI;
  ::std::ostream::write((char *)in_RSI,(long)in_RDI);
  if (*in_RDI == 0) {
    local_8 = 8;
  }
  else {
    ::std::ostream::write((char *)local_18,(long)(in_RDI + 1));
    ::std::ostream::write((char *)local_18,(long)(in_RDI + 2));
    ::std::ostream::write((char *)local_18,(long)(in_RDI + 3));
    ::std::ostream::write((char *)local_18,(long)(in_RDI + 4));
    ::std::ostream::write((char *)local_18,(long)(in_RDI + 5));
    ::std::ostream::write((char *)local_18,(long)(in_RDI + 6));
    local_20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x26));
    ::std::ostream::write((char *)local_18,(long)&local_20);
    local_28 = std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>::size
                         ((vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_> *)
                          (in_RDI + 0x2f));
    ::std::ostream::write((char *)local_18,(long)&local_28);
    local_30 = 0x40;
    cgap_dictionary::serialize(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    for (local_38 = 0; pbVar1 = local_18, local_38 < (ulong)in_RDI[5]; local_38 = local_38 + 1) {
      local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_39 = ::std::_Bit_reference::operator_cast_to_bool(&local_50);
      ::std::ostream::write((char *)local_18,(long)&local_39);
    }
    local_30 = in_RDI[5] + local_30;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1233e3);
    ::std::ostream::write((char *)pbVar1,(long)puVar3);
    local_30 = in_RDI[5] * 8 + local_30;
    pbVar5 = local_18;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x123433);
    ::std::ostream::write((char *)pbVar5,(long)puVar3);
    local_30 = local_20 * 8 + local_30;
    this_00 = local_18;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x123486);
    ::std::ostream::write((char *)this_00,(long)puVar3);
    pbVar1 = local_18;
    local_30 = in_RDI[5] * 8 + local_30;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1234d6);
    ::std::ostream::write((char *)pbVar1,(long)puVar3);
    local_30 = local_20 * 8 + local_30;
    local_58 = in_RDI + 0x2f;
    local_60._M_current =
         (bsd_cgap *)
         std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>::begin
                   (in_stack_fffffffffffffe88);
    std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>::end(in_stack_fffffffffffffe88);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<bwtil::bsd_cgap_*,_std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<bwtil::bsd_cgap_*,_std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>_>
                          *)in_stack_fffffffffffffe88);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<bwtil::bsd_cgap_*,_std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>_>
      ::operator*(&local_60);
      in_stack_fffffffffffffe90 = (bsd_cgap *)&stack0xfffffffffffffed8;
      bsd_cgap::bsd_cgap(this_00,pbVar5);
      uVar4 = bsd_cgap::serialize(in_stack_fffffffffffffee0,(ostream *)in_stack_fffffffffffffed8);
      local_30 = uVar4 + local_30;
      bsd_cgap::~bsd_cgap(in_stack_fffffffffffffe90);
      __gnu_cxx::
      __normal_iterator<bwtil::bsd_cgap_*,_std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>_>
      ::operator++(&local_60);
    }
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x123606);
    ::std::ostream::write((char *)local_18,(long)puVar3);
    local_8 = in_RDI[6] * 8 + local_30;
  }
  return local_8;
}

Assistant:

ulint serialize(std::ostream& out){

		out.write((char *)&W, sizeof(ulint));

		if(W==0) return sizeof(ulint);

		out.write((char *)&u, sizeof(ulint));
		out.write((char *)&n, sizeof(ulint));
		out.write((char *)&v, sizeof(ulint));
		out.write((char *)&t, sizeof(ulint));
		out.write((char *)&number_of_v_blocks, sizeof(ulint));
		out.write((char *)&number_of_t_blocks, sizeof(ulint));

		ulint v_sel_size = V_select.size();
		out.write((char *)&v_sel_size, sizeof(ulint));

		ulint bsds_size = BSDs.size();
		out.write((char *)&bsds_size, sizeof(ulint));

		ulint w_bytes = 8*sizeof(ulint);

		D.serialize(out);

		for(ulint i=0;i<number_of_v_blocks;++i){
			bool b = V[i];
			out.write((char *)&b, sizeof(bool));
		}

		w_bytes += number_of_v_blocks*sizeof(bool);

		out.write((char *)V_rank.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)V_select.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		out.write((char *)R.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)R_1.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		for(auto bsd : BSDs)
			w_bytes += bsd.serialize(out);

		out.write((char *)SEL.data(), number_of_t_blocks*sizeof(ulint));
		w_bytes += number_of_t_blocks*sizeof(ulint);

		return w_bytes;

	}